

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O0

float scnrm2(int n,complex<float> *x,int incx)

{
  float fVar1;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double dVar2;
  __type _Var3;
  float local_34;
  float value;
  float temp;
  float ssq;
  float scale;
  int ix;
  int i;
  int incx_local;
  complex<float> *x_local;
  int n_local;
  
  if ((n < 1) || (incx < 1)) {
    local_34 = 0.0;
  }
  else {
    temp = 0.0;
    value = 1.0;
    ssq = 0.0;
    for (scale = 0.0; (int)scale < n; scale = (float)((int)scale + 1)) {
      fVar1 = std::real<float>(x + (int)ssq);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        fVar1 = std::real<float>(x + (int)ssq);
        dVar2 = std::fabs((double)CONCAT44(extraout_XMM0_Db,fVar1));
        fVar1 = SUB84(dVar2,0);
        if (fVar1 <= temp) {
          _Var3 = std::pow<float,int>(fVar1 / temp,2);
          dVar2 = (double)value + _Var3;
        }
        else {
          _Var3 = std::pow<float,int>(temp / fVar1,2);
          dVar2 = (double)value * _Var3 + 1.0;
          temp = fVar1;
        }
        value = (float)dVar2;
      }
      fVar1 = std::imag<float>(x + (int)ssq);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        fVar1 = std::imag<float>(x + (int)ssq);
        dVar2 = std::fabs((double)CONCAT44(extraout_XMM0_Db_00,fVar1));
        fVar1 = SUB84(dVar2,0);
        if (fVar1 <= temp) {
          _Var3 = std::pow<float,int>(fVar1 / temp,2);
          dVar2 = (double)value + _Var3;
        }
        else {
          _Var3 = std::pow<float,int>(temp / fVar1,2);
          dVar2 = (double)value * _Var3 + 1.0;
          temp = fVar1;
        }
        value = (float)dVar2;
      }
      ssq = (float)((int)ssq + incx);
    }
    dVar2 = std::sqrt((double)(ulong)(uint)value);
    local_34 = temp * SUB84(dVar2,0);
  }
  return local_34;
}

Assistant:

float scnrm2 ( int n, complex <float> x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    SCNRM2 returns the euclidean norm of a vector.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//    SCNRM2 := sqrt ( sum ( conjg ( x(1:n) ) * x(1:n) ) )
//            = sqrt ( dot_product ( x(1:n), x(1:n) ) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <float> X[], the vector.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Output, float SCNRM2, the norm of the vector.
//
{
  int i;
  int ix;
  float scale;
  float ssq;
  float temp;
  float value;

  if ( n < 1 || incx < 1 )
  {
    value  = 0.0;
  }
  else
  {
    scale = 0.0;
    ssq = 1.0;
    ix = 0;

    for ( i = 0; i < n; i++ )
    {
      if ( real ( x[ix] ) != 0.0 )
      {
        temp = fabs ( real ( x[ix] ) );
        if ( scale < temp )
        {
          ssq = 1.0 + ssq * pow ( scale / temp, 2 );
          scale = temp;
        }
        else
        {
          ssq = ssq + pow ( temp / scale, 2 );
        }
      }

      if ( imag ( x[ix] ) != 0.0 )
      {
        temp = fabs ( imag ( x[ix] ) );
        if ( scale < temp )
        {
          ssq = 1.0 + ssq * pow ( scale / temp, 2 );
          scale = temp;
        }
        else
        {
          ssq = ssq + pow ( temp / scale, 2 );
        }
      }
      ix = ix + incx;
    }
    value  = scale * sqrt ( ssq );
  }
  return value;
}